

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O1

int __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::copy
          (basic_string_view<char,_std::char_traits<char>_> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  EVP_PKEY_CTX *pEVar1;
  logic_error *this_00;
  ulong in_RCX;
  out_of_range local_20 [16];
  
  pEVar1 = (EVP_PKEY_CTX *)(this->size_ - in_RCX);
  if (in_RCX <= this->size_) {
    if (pEVar1 < src) {
      src = pEVar1;
    }
    if (src != (EVP_PKEY_CTX *)0x0) {
      memcpy(dst,this->data_ + in_RCX,(size_t)src);
    }
    return (int)src;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(local_20,"nonstd::string_view::copy()");
  std::logic_error::logic_error(this_00,(logic_error *)local_20);
  *(code **)this_00 = std::ostream::_M_insert<long>;
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

nssv_constexpr size_type size()     const nssv_noexcept { return size_; }